

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall
SetInstance::SetInstance
          (SetInstance *this,string *element_type,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined8 *puVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  char *in_stack_ffffffffffffff78;
  undefined5 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  string *in_stack_ffffffffffffff88;
  Instance *in_stack_ffffffffffffff90;
  string *this_00;
  allocator local_41;
  string local_40 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  
  local_20 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Set",&local_41);
  Instance::Instance(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  *in_RDI = &PTR__SetInstance_0020ee50;
  this_00 = (string *)(in_RDI + 0xb);
  std::__cxx11::string::string(this_00);
  std::
  set<std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::shared_ptr<Instance>_>_>
  ::set((set<std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::shared_ptr<Instance>_>_>
         *)0x1c23e7);
  std::__cxx11::string::operator=(this_00,in_RSI);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff87,
                                   CONCAT16(in_stack_ffffffffffffff86,
                                            CONCAT15(in_stack_ffffffffffffff85,
                                                     in_stack_ffffffffffffff80))),
                          in_stack_ffffffffffffff78);
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff86,
                                                    CONCAT15(in_stack_ffffffffffffff85,
                                                             in_stack_ffffffffffffff80))),
                            in_stack_ffffffffffffff78);
    if (!bVar1) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "RuntimeError: invalid message.";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
  }
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_20);
  if (sVar2 != 1) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_20,0);
  bVar1 = Grammar::is_variable(in_RDX);
  if (!bVar1) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_20,0);
  std::__cxx11::string::operator=((string *)(in_RDI + 7),(string *)pvVar3);
  return;
}

Assistant:

SetInstance::SetInstance(const std::string& element_type, const std::string& message_name,
                         const std::vector<std::string>& arguments) : Instance("Set") {
    _element_type = element_type;
    if (message_name == "create:" || message_name == "createIfNotExists:") {
        if (arguments.size() != 1)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_variable(arguments[0]))
            throw EXC_INVALID_ARGUMENT;
        _name = arguments[0];
    }
    else
        throw EXC_INVALID_MESSAGE;
}